

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

bool __thiscall Datetime::initializeOrdinal(Datetime *this,Pig *pig)

{
  int iVar1;
  longlong lVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_type previous;
  tm *__tp;
  time_t tVar6;
  long lVar7;
  int year;
  long lVar8;
  int month;
  longlong number;
  int character2;
  int character1;
  time_t now;
  longlong local_50;
  int local_48;
  int local_44;
  ulong local_40;
  time_t local_38;
  
  previous = Pig::cursor(pig);
  local_50 = 0;
  bVar3 = Pig::getDigits(pig,&local_50);
  if ((((bVar3) && (local_50 - 1U < 0x1f)) && (bVar3 = Pig::getCharacter(pig,&local_44), bVar3)) &&
     (bVar3 = Pig::getCharacter(pig,&local_48), bVar3)) {
    uVar4 = Pig::peek(pig);
    bVar3 = unicodeLatinAlpha(uVar4);
    if (!bVar3) {
      uVar4 = Pig::peek(pig);
      bVar3 = unicodeLatinDigit(uVar4);
      if (!bVar3) {
        lVar8 = local_50 % 10;
        lVar7 = local_50 % 100;
        if (((((local_44 == 0x73 && lVar8 == 1) && lVar7 != 0xb) && local_48 == 0x74) ||
            (((local_44 == 0x6e && lVar8 == 2) && lVar7 != 0xc) && local_48 == 100)) ||
           ((((local_44 == 0x72 && lVar8 == 3) && lVar7 != 0xd) && local_48 == 100 ||
            ((local_48 == 0x68 && local_44 == 0x74) &&
             ((3 < lVar8 || lVar8 == 0) || lVar7 - 0xbU < 3))))) {
          local_38 = time((time_t *)0x0);
          __tp = localtime(&local_38);
          lVar2 = local_50;
          uVar4 = __tp->tm_mon;
          iVar1 = __tp->tm_year;
          year = iVar1 + 0x76c;
          if (((timeRelative == true) && (0 < local_50)) && (local_50 <= __tp->tm_mday)) {
            if (10 < (int)uVar4) {
              year = iVar1 + 0x76d;
            }
            month = 1;
            if ((int)uVar4 < 0xb) {
              month = uVar4 + 2;
            }
          }
          else {
            month = uVar4 + 1;
            if (((timeRelative == false) && (__tp->tm_mday < local_50)) &&
               (local_40 = (ulong)uVar4, iVar5 = daysInMonth(year,month), lVar2 <= iVar5)) {
              iVar5 = (int)local_40;
              if (iVar5 < 1) {
                year = iVar1 + 0x76b;
              }
              month = 0xc;
              if (0 < iVar5) {
                month = iVar5;
              }
            }
          }
          __tp->tm_sec = 0;
          __tp->tm_min = 0;
          __tp->tm_hour = 0;
          __tp->tm_mon = month + -1;
          __tp->tm_mday = (int)local_50;
          __tp->tm_year = year + -0x76c;
          __tp->tm_isdst = -1;
          tVar6 = mktime(__tp);
          this->_date = tVar6;
          return true;
        }
      }
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::initializeOrdinal (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  long long number = 0;
  if (pig.getDigits (number) &&
      number > 0             &&
      number <= 31)
  {
    int character1;
    int character2;
    if (pig.getCharacter (character1)     &&
        pig.getCharacter (character2)     &&
        ! unicodeLatinAlpha (pig.peek ()) &&
        ! unicodeLatinDigit (pig.peek ()))
    {
      int remainder1 = number % 10;
      int remainder2 = number % 100;
      if ((remainder2 != 11 && remainder1 == 1 && character1 == 's' && character2 == 't') ||
          (remainder2 != 12 && remainder1 == 2 && character1 == 'n' && character2 == 'd') ||
          (remainder2 != 13 && remainder1 == 3 && character1 == 'r' && character2 == 'd') ||
          ((remainder2 == 11 ||
            remainder2 == 12 ||
            remainder2 == 13 ||
            remainder1 == 0 ||
            remainder1 > 3) && character1 == 't' && character2 == 'h'))
      {
        time_t now = time (nullptr);
        struct tm* t = localtime (&now);

        int y = t->tm_year + 1900;
        int m = t->tm_mon + 1;
        int d = t->tm_mday;

        if (timeRelative && (1 <= number && number <= d))
        {
          if (++m > 12)
          {
            m = 1;
            y++;
          }
        }
        else if (!timeRelative && (d < number && number <= daysInMonth (y, m)))
        {
          if (--m < 1)
          {
            m = 12;
            y--;
          }
        }

        t->tm_hour = t->tm_min = t->tm_sec = 0;
        t->tm_mon  = m - 1;
        t->tm_mday = number;
        t->tm_year = y - 1900;
        t->tm_isdst = -1;

        _date = mktime (t);

        return true;
      }
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}